

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand.h
# Opt level: O0

void __thiscall hand::sortHand(hand *this)

{
  bool bVar1;
  vector<card,_std::allocator<card>_> *pvVar2;
  pointer pvVar3;
  vector<card,std::allocator<card>> *this_00;
  iterator __first;
  iterator __last;
  type __x;
  __normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_> local_80;
  const_iterator local_78;
  card *local_70;
  __normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_> local_68;
  card *local_60;
  __normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_> local_58;
  reference local_50;
  card *i;
  iterator __end1;
  iterator __begin1;
  vector<card,_std::allocator<card>_> *__range1;
  unique_ptr<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
  local_20;
  unique_ptr<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
  specialHand;
  unique_ptr<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
  regHand;
  hand *this_local;
  
  pvVar2 = (vector<card,_std::allocator<card>_> *)operator_new(0x18);
  std::vector<card,_std::allocator<card>_>::vector(pvVar2);
  std::
  unique_ptr<std::vector<card,std::allocator<card>>,std::default_delete<std::vector<card,std::allocator<card>>>>
  ::unique_ptr<std::default_delete<std::vector<card,std::allocator<card>>>,void>
            ((unique_ptr<std::vector<card,std::allocator<card>>,std::default_delete<std::vector<card,std::allocator<card>>>>
              *)&specialHand,pvVar2);
  pvVar2 = (vector<card,_std::allocator<card>_> *)operator_new(0x18);
  std::vector<card,_std::allocator<card>_>::vector(pvVar2);
  std::
  unique_ptr<std::vector<card,std::allocator<card>>,std::default_delete<std::vector<card,std::allocator<card>>>>
  ::unique_ptr<std::default_delete<std::vector<card,std::allocator<card>>>,void>
            ((unique_ptr<std::vector<card,std::allocator<card>>,std::default_delete<std::vector<card,std::allocator<card>>>>
              *)&local_20,pvVar2);
  __end1 = std::vector<card,_std::allocator<card>_>::begin(&this->hand_);
  i = (card *)std::vector<card,_std::allocator<card>_>::end(&this->hand_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_>
                                *)&i);
    if (!bVar1) break;
    local_50 = __gnu_cxx::__normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_>::
               operator*(&__end1);
    bVar1 = isRegularCard(local_50);
    if (bVar1) {
      pvVar3 = std::
               unique_ptr<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
               ::operator->(&specialHand);
      std::vector<card,_std::allocator<card>_>::push_back(pvVar3,local_50);
    }
    else {
      pvVar3 = std::
               unique_ptr<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
               ::operator->(&local_20);
      std::vector<card,_std::allocator<card>_>::push_back(pvVar3,local_50);
    }
    __gnu_cxx::__normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_>::operator++
              (&__end1);
  }
  pvVar3 = std::
           unique_ptr<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
           ::operator->(&specialHand);
  local_58._M_current = (card *)std::vector<card,_std::allocator<card>_>::begin(pvVar3);
  pvVar3 = std::
           unique_ptr<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
           ::operator->(&specialHand);
  local_60 = (card *)std::vector<card,_std::allocator<card>_>::end(pvVar3);
  std::
  sort<__gnu_cxx::__normal_iterator<card*,std::vector<card,std::allocator<card>>>,bool(*)(card_const&,card_const&)>
            (local_58,(__normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_>)local_60
             ,sortByValue);
  pvVar3 = std::
           unique_ptr<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
           ::operator->(&local_20);
  local_68._M_current = (card *)std::vector<card,_std::allocator<card>_>::begin(pvVar3);
  pvVar3 = std::
           unique_ptr<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
           ::operator->(&local_20);
  local_70 = (card *)std::vector<card,_std::allocator<card>_>::end(pvVar3);
  std::
  sort<__gnu_cxx::__normal_iterator<card*,std::vector<card,std::allocator<card>>>,bool(*)(card_const&,card_const&)>
            (local_68,(__normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_>)local_70
             ,sortByName);
  this_00 = (vector<card,std::allocator<card>> *)
            std::
            unique_ptr<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
            ::operator->(&specialHand);
  pvVar3 = std::
           unique_ptr<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
           ::operator->(&specialHand);
  local_80._M_current = (card *)std::vector<card,_std::allocator<card>_>::end(pvVar3);
  __gnu_cxx::__normal_iterator<card_const*,std::vector<card,std::allocator<card>>>::
  __normal_iterator<card*>
            ((__normal_iterator<card_const*,std::vector<card,std::allocator<card>>> *)&local_78,
             &local_80);
  pvVar3 = std::
           unique_ptr<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
           ::operator->(&local_20);
  __first = std::vector<card,_std::allocator<card>_>::begin(pvVar3);
  pvVar3 = std::
           unique_ptr<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
           ::operator->(&local_20);
  __last = std::vector<card,_std::allocator<card>_>::end(pvVar3);
  std::vector<card,std::allocator<card>>::
  insert<__gnu_cxx::__normal_iterator<card*,std::vector<card,std::allocator<card>>>,void>
            (this_00,local_78,
             (__normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_>)
             __first._M_current,
             (__normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_>)__last._M_current
            );
  __x = std::
        unique_ptr<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
        ::operator*(&specialHand);
  std::vector<card,_std::allocator<card>_>::swap(&this->hand_,__x);
  std::
  unique_ptr<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
  ::~unique_ptr(&local_20);
  std::
  unique_ptr<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
  ::~unique_ptr(&specialHand);
  return;
}

Assistant:

void hand::sortHand() {
    unique_ptr <vector<card>> regHand(new vector<card>);
    unique_ptr <vector<card>> specialHand(new vector<card>);
    for (auto &i : hand_) {
        if(isRegularCard(i))regHand->push_back(i);
        else specialHand->push_back(i);
    }
    sort(regHand->begin(),regHand->end(),sortByValue);
    sort(specialHand->begin(),specialHand->end(),sortByName);
    regHand->insert(regHand->end(),specialHand->begin(),specialHand->end());
    hand_.swap(*regHand);
}